

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikcp.c
# Opt level: O2

void ikcp_release(ikcpcb *kcp)

{
  IQUEUEHEAD *pIVar1;
  IQUEUEHEAD *pIVar2;
  IQUEUEHEAD *pIVar3;
  
  if (kcp != (ikcpcb *)0x0) {
    while (pIVar1 = (kcp->snd_buf).next, &kcp->snd_buf != pIVar1) {
      pIVar2 = pIVar1->next;
      pIVar3 = pIVar1->prev;
      pIVar2->prev = pIVar3;
      pIVar3->next = pIVar2;
      pIVar1->next = (IQUEUEHEAD *)0x0;
      pIVar1->prev = (IQUEUEHEAD *)0x0;
      ikcp_free(pIVar1);
    }
    while (pIVar1 = (kcp->rcv_buf).next, &kcp->rcv_buf != pIVar1) {
      pIVar2 = pIVar1->next;
      pIVar3 = pIVar1->prev;
      pIVar2->prev = pIVar3;
      pIVar3->next = pIVar2;
      pIVar1->next = (IQUEUEHEAD *)0x0;
      pIVar1->prev = (IQUEUEHEAD *)0x0;
      ikcp_free(pIVar1);
    }
    while (pIVar1 = (kcp->snd_queue).next, &kcp->snd_queue != pIVar1) {
      pIVar2 = pIVar1->next;
      pIVar3 = pIVar1->prev;
      pIVar2->prev = pIVar3;
      pIVar3->next = pIVar2;
      pIVar1->next = (IQUEUEHEAD *)0x0;
      pIVar1->prev = (IQUEUEHEAD *)0x0;
      ikcp_free(pIVar1);
    }
    while (pIVar1 = (kcp->rcv_queue).next, &kcp->rcv_queue != pIVar1) {
      pIVar2 = pIVar1->next;
      pIVar3 = pIVar1->prev;
      pIVar2->prev = pIVar3;
      pIVar3->next = pIVar2;
      pIVar1->next = (IQUEUEHEAD *)0x0;
      pIVar1->prev = (IQUEUEHEAD *)0x0;
      ikcp_free(pIVar1);
    }
    if (kcp->buffer != (char *)0x0) {
      ikcp_free(kcp->buffer);
    }
    if (kcp->acklist != (IUINT32 *)0x0) {
      ikcp_free(kcp->acklist);
    }
    kcp->ackcount = 0;
    kcp->buffer = (char *)0x0;
    kcp->acklist = (IUINT32 *)0x0;
    kcp->nrcv_buf = 0;
    kcp->nsnd_buf = 0;
    kcp->nrcv_que = 0;
    kcp->nsnd_que = 0;
    ikcp_free(kcp);
    return;
  }
  __assert_fail("kcp",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/3rd/kcp/ikcp.c"
                ,0x12f,"void ikcp_release(ikcpcb *)");
}

Assistant:

void ikcp_release(ikcpcb *kcp)
{
	assert(kcp);
	if (kcp) {
		IKCPSEG *seg;
		while (!iqueue_is_empty(&kcp->snd_buf)) {
			seg = iqueue_entry(kcp->snd_buf.next, IKCPSEG, node);
			iqueue_del(&seg->node);
			ikcp_segment_delete(kcp, seg);
		}
		while (!iqueue_is_empty(&kcp->rcv_buf)) {
			seg = iqueue_entry(kcp->rcv_buf.next, IKCPSEG, node);
			iqueue_del(&seg->node);
			ikcp_segment_delete(kcp, seg);
		}
		while (!iqueue_is_empty(&kcp->snd_queue)) {
			seg = iqueue_entry(kcp->snd_queue.next, IKCPSEG, node);
			iqueue_del(&seg->node);
			ikcp_segment_delete(kcp, seg);
		}
		while (!iqueue_is_empty(&kcp->rcv_queue)) {
			seg = iqueue_entry(kcp->rcv_queue.next, IKCPSEG, node);
			iqueue_del(&seg->node);
			ikcp_segment_delete(kcp, seg);
		}
		if (kcp->buffer) {
			ikcp_free(kcp->buffer);
		}
		if (kcp->acklist) {
			ikcp_free(kcp->acklist);
		}

		kcp->nrcv_buf = 0;
		kcp->nsnd_buf = 0;
		kcp->nrcv_que = 0;
		kcp->nsnd_que = 0;
		kcp->ackcount = 0;
		kcp->buffer = NULL;
		kcp->acklist = NULL;
		ikcp_free(kcp);
	}
}